

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cost.cpp
# Opt level: O0

void __thiscall iDynTree::optimalcontrol::Cost::Cost(Cost *this,string *costName)

{
  string *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Cost_003faba8;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  return;
}

Assistant:

Cost::Cost(const std::string &costName)
            :m_costName(costName)
        { }